

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O2

MCode * lj_mcode_patch(jit_State *J,MCode *ptr,int finish)

{
  int iVar1;
  MCode *mc;
  MCode *__addr;
  
  __addr = J->mcarea;
  if (finish == 0) {
    if ((ptr < __addr) || (__addr + J->szmcarea <= ptr)) {
      do {
        do {
          __addr = *(MCode **)__addr;
        } while (ptr < __addr);
      } while (__addr + *(size_t *)(__addr + 8) <= ptr);
      iVar1 = mprotect(__addr,*(size_t *)(__addr + 8),3);
      if (iVar1 != 0) {
        mcode_protfail(J);
      }
    }
    else {
      mcode_protect(J,3);
    }
  }
  else {
    if (__addr == ptr) {
      mcode_protect(J,5);
    }
    else {
      iVar1 = mprotect(ptr,*(size_t *)(ptr + 8),5);
      if (iVar1 != 0) {
        mcode_protfail(J);
      }
    }
    __addr = (MCode *)0x0;
  }
  return __addr;
}

Assistant:

MCode *lj_mcode_patch(jit_State *J, MCode *ptr, int finish)
{
  if (finish) {
#if LUAJIT_SECURITY_MCODE
    if (J->mcarea == ptr)
      mcode_protect(J, MCPROT_RUN);
    else if (LJ_UNLIKELY(mcode_setprot(ptr, ((MCLink *)ptr)->size, MCPROT_RUN)))
      mcode_protfail(J);
#endif
    return NULL;
  } else {
    MCode *mc = J->mcarea;
    /* Try current area first to use the protection cache. */
    if (ptr >= mc && ptr < (MCode *)((char *)mc + J->szmcarea)) {
#if LUAJIT_SECURITY_MCODE
      mcode_protect(J, MCPROT_GEN);
#endif
      return mc;
    }
    /* Otherwise search through the list of MCode areas. */
    for (;;) {
      mc = ((MCLink *)mc)->next;
      lj_assertJ(mc != NULL, "broken MCode area chain");
      if (ptr >= mc && ptr < (MCode *)((char *)mc + ((MCLink *)mc)->size)) {
#if LUAJIT_SECURITY_MCODE
	if (LJ_UNLIKELY(mcode_setprot(mc, ((MCLink *)mc)->size, MCPROT_GEN)))
	  mcode_protfail(J);
#endif
	return mc;
      }
    }
  }
}